

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void __thiscall
absl::lts_20250127::internal_any_invocable::CoreImpl<false,void,google::protobuf::io::Printer*>::
InitializeRemoteManager<google::protobuf::compiler::cpp::FileGenerator::GenerateSource(google::protobuf::io::Printer*)::__0,google::protobuf::compiler::cpp::FileGenerator::GenerateSource(google::protobuf::io::Printer*)::__0,void>
          (CoreImpl<false,void,google::protobuf::io::Printer*> *this,type *args)

{
  void *__p;
  undefined8 *puVar1;
  pointer pvVar2;
  TrivialDeleter local_30;
  undefined1 local_28 [8];
  unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter> uninitialized_target;
  type *args_local;
  CoreImpl<false,_void,_google::protobuf::io::Printer_*> *this_local;
  
  uninitialized_target._M_t.
  super___uniq_ptr_impl<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = args;
  __p = operator_new(0x18);
  TrivialDeleter::TrivialDeleter(&local_30,0x18);
  std::unique_ptr<void,absl::lts_20250127::internal_any_invocable::TrivialDeleter>::
  unique_ptr<absl::lts_20250127::internal_any_invocable::TrivialDeleter,void>
            ((unique_ptr<void,absl::lts_20250127::internal_any_invocable::TrivialDeleter> *)local_28
             ,__p,&local_30);
  puVar1 = (undefined8 *)
           std::unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>::get
                     ((unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
                       *)local_28);
  *puVar1 = *uninitialized_target._M_t.
             super___uniq_ptr_impl<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_void_*,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
             .super__Head_base<0UL,_void_*,_false>._M_head_impl;
  puVar1[1] = *(undefined8 *)
               ((long)uninitialized_target._M_t.
                      super___uniq_ptr_impl<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_void_*,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
                      .super__Head_base<0UL,_void_*,_false>._M_head_impl + 8);
  puVar1[2] = *(undefined8 *)
               ((long)uninitialized_target._M_t.
                      super___uniq_ptr_impl<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_void_*,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>
                      .super__Head_base<0UL,_void_*,_false>._M_head_impl + 0x10);
  pvVar2 = std::unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>::
           release((unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter> *)
                   local_28);
  *(pointer *)this = pvVar2;
  *(undefined8 *)(this + 8) = 0x18;
  *(code **)(this + 0x10) = RemoteManagerTrivial;
  std::unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter>::~unique_ptr
            ((unique_ptr<void,_absl::lts_20250127::internal_any_invocable::TrivialDeleter> *)
             local_28);
  return;
}

Assistant:

void InitializeRemoteManager(Args&&... args) {
    // unique_ptr is used for exception-safety in case construction throws.
    std::unique_ptr<void, TrivialDeleter> uninitialized_target(
        ::operator new(sizeof(T)), TrivialDeleter(sizeof(T)));
    ::new (uninitialized_target.get()) T(std::forward<Args>(args)...);
    state_.remote.target = uninitialized_target.release();
    state_.remote.size = sizeof(T);
    manager_ = RemoteManagerTrivial;
  }